

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReaderCache::pruneData(PtexReaderCache *this)

{
  size_t *psVar1;
  size_t sVar2;
  bool bVar3;
  PtexCachedReader *this_00;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  size_t memUsedChange;
  size_t local_30;
  
  sVar2 = this->_memUsed;
  lVar6 = 0;
  while ((this->_maxMem < lVar6 + sVar2 &&
         (this_00 = PtexLruList<Ptex::v2_2::PtexCachedReader,_&Ptex::v2_2::PtexCachedReader::_activeFilesItem>
                    ::pop(&this->_activeFiles), this_00 != (PtexCachedReader *)0x0))) {
    bVar3 = PtexCachedReader::tryPrune(this_00,&local_30);
    sVar4 = local_30;
    if (!bVar3) {
      sVar4 = 0;
    }
    lVar6 = lVar6 + sVar4;
  }
  if (lVar6 != 0) {
    LOCK();
    psVar1 = &this->_memUsed;
    sVar2 = *psVar1;
    *psVar1 = *psVar1 + lVar6;
    UNLOCK();
    uVar5 = sVar2 + lVar6;
    if (sVar2 + lVar6 < this->_peakMemUsed) {
      uVar5 = this->_peakMemUsed;
    }
    this->_peakMemUsed = uVar5;
  }
  return;
}

Assistant:

void PtexReaderCache::pruneData()
{
    size_t memUsedChangeTotal = 0;
    size_t memUsed = _memUsed;
    while (memUsed + memUsedChangeTotal > _maxMem) {
        PtexCachedReader* reader = _activeFiles.pop();
        if (!reader) break;
        size_t memUsedChange;
        if (reader->tryPrune(memUsedChange)) {
            // Note: after clearing, memUsedChange is negative
            memUsedChangeTotal += memUsedChange;
        }
    }
    adjustMemUsed(memUsedChangeTotal);
}